

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O0

bufsize_t __thiscall SecurityDirWrapper::getSize(SecurityDirWrapper *this)

{
  WIN_CERTIFICATE *pWVar1;
  SecurityDirWrapper *local_28;
  bufsize_t fullSize;
  WIN_CERTIFICATE *cert;
  SecurityDirWrapper *this_local;
  
  pWVar1 = getCert(this);
  if (pWVar1 == (WIN_CERTIFICATE *)0x0) {
    this_local = (SecurityDirWrapper *)0x0;
  }
  else {
    local_28 = (SecurityDirWrapper *)0xc;
    if (((this->super_DataDirEntryWrapper).field_0x4c & 1) != 0) {
      local_28 = (SecurityDirWrapper *)(ulong)pWVar1->dwLength;
    }
    this_local = local_28;
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t SecurityDirWrapper::getSize()
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    bufsize_t fullSize = static_cast<bufsize_t>(sizeof(pe::WIN_CERTIFICATE)); // TODO: check it
    if (this->sizeOk) {
        fullSize = static_cast<bufsize_t>(cert->dwLength);
    }
    return fullSize;
}